

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::array::writer<std::wostream>
          (array *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  pointer psVar1;
  element_type *peVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  wostream *os_00;
  undefined4 extraout_var;
  value_ptr *value_1;
  pointer psVar6;
  char *pcVar7;
  value_ptr *value;
  bool bVar8;
  int local_3c;
  undefined4 local_38;
  wchar_t local_34;
  
  psVar6 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->values_).
      super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar6) {
    psVar1 = (this->values_).
             super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = psVar6 == psVar1;
    if (!bVar8) {
      iVar5 = (*((psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_value[0x12])();
      cVar4 = (char)iVar5;
      while (cVar4 != '\0') {
        psVar6 = psVar6 + 1;
        bVar8 = psVar6 == psVar1;
        if (bVar8) break;
        iVar5 = (*((psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->_vptr_value[0x12])();
        cVar4 = (char)iVar5;
      }
    }
    if (!bVar8) {
      plVar3 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar3 == (long *)0x0) {
        std::__throw_bad_cast();
      }
      local_34 = (**(code **)(*plVar3 + 0x50))(plVar3,10);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_34,1);
      psVar6 = (this->values_).
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (this->values_).
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar6 == psVar1) {
        return os;
      }
      pcVar7 = "";
      do {
        os_00 = std::operator<<(os,pcVar7);
        dump::operator<<(os_00,ind);
        std::operator<<(os_00,"- ");
        peVar2 = (psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar5 = (*peVar2->_vptr_value[2])(peVar2);
        local_3c = ind->count_ + 2 + (uint)(CONCAT44(extraout_var,iVar5) == 0) * 2;
        (*peVar2->_vptr_value[0x16])(peVar2,os,&local_3c);
        psVar6 = psVar6 + 1;
        pcVar7 = "\n";
      } while (psVar6 != psVar1);
      return os;
    }
  }
  std::operator<<(os,"[");
  psVar6 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar1) {
    pcVar7 = " ";
    do {
      std::operator<<(os,pcVar7);
      peVar2 = (psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_38 = 0;
      (*peVar2->_vptr_value[0x16])(peVar2,os,&local_38);
      psVar6 = psVar6 + 1;
      pcVar7 = ", ";
    } while (psVar6 != psVar1);
  }
  std::operator<<(os," ]");
  return os;
}

Assistant:

OStream & array::writer (OStream & os, indent const & ind) const {
            char const * sep = "";

            bool const is_compact = values_.size () == 0 || this->is_number_array ();
            if (is_compact) {
                os << "[";
                sep = " ";
                for (value_ptr const & value : values_) {
                    os << sep;
                    value->write_impl (os, indent ());
                    sep = ", ";
                }
                os << " ]";
            } else {
                os << '\n';
                for (value_ptr const & value : values_) {
                    os << sep << ind << "- ";
                    value->write_impl (os,
                                       ind.next (value->dynamic_cast_object () == nullptr ? 4 : 2));
                    sep = "\n";
                }
            }
            return os;
        }